

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O2

void __thiscall
SceneRender::setShaders
          (SceneRender *this,Uniforms *_uniforms,string *_fragmentShader,string *_vertexShader)

{
  vector<vera::Model_*,_std::allocator<vera::Model_*>_> *pvVar1;
  pointer ppMVar2;
  pointer ppMVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  Shader *pSVar10;
  _Rb_tree_node_base *p_Var11;
  Model *pMVar12;
  long lVar13;
  DefaultShaders _type;
  DefaultShaders _type_00;
  DefaultShaders _type_01;
  DefaultShaders _type_02;
  DefaultShaders _type_03;
  DefaultShaders _type_04;
  DefaultShaders _type_05;
  DefaultShaders _type_06;
  DefaultShaders _type_07;
  long lVar14;
  long extraout_RDX;
  long extraout_RDX_00;
  ulong uVar15;
  undefined1 auVar16 [16];
  string local_298;
  allocator local_271;
  string local_270;
  _Rb_tree_node_base *local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  string local_228;
  string bufferName;
  int local_15c [3];
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  bVar4 = checkBackground(_fragmentShader);
  this->m_background = bVar4;
  if (bVar4) {
    std::__cxx11::string::string((string *)&bufferName,"BACKGROUND",(allocator *)&local_248);
    std::__cxx11::string::string((string *)&local_298,"",(allocator *)&local_228);
    pSVar10 = &this->m_background_shader;
    vera::HaveDefines::addDefine(&pSVar10->super_HaveDefines,&bufferName,&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&bufferName);
    vera::getDefaultSrc_abi_cxx11_(&bufferName,(vera *)0x5,_type);
    vera::Shader::setSource(pSVar10,_fragmentShader,&bufferName);
    std::__cxx11::string::~string((string *)&bufferName);
    std::__cxx11::string::string((string *)&bufferName,"GLSLVIEWER",&local_271);
    local_15c[2] = 3;
    vera::toString<int>(&local_228,local_15c + 2);
    local_15c[1] = 3;
    vera::toString<int>(&local_270,local_15c + 1);
    std::operator+(&local_248,&local_228,&local_270);
    local_15c[0] = 0;
    vera::toString<int>(&local_150,local_15c);
    std::operator+(&local_298,&local_248,&local_150);
    vera::HaveDefines::addDefine(&pSVar10->super_HaveDefines,&bufferName,&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&bufferName);
  }
  bVar4 = findId(_fragmentShader,"u_scenePosition;");
  bVar5 = findId(_fragmentShader,"u_sceneNormal;");
  bVar6 = findId(_fragmentShader,"u_lightShadowMap;");
  this->m_shadows = bVar6;
  iVar7 = countSceneBuffers(_vertexShader);
  iVar8 = countSceneBuffers(_fragmentShader);
  if (iVar8 < iVar7) {
    iVar8 = iVar7;
  }
  this->m_buffers_total = (long)iVar8;
  local_250 = &(_uniforms->super_Scene).models._M_t._M_impl.super__Rb_tree_header._M_header;
  for (p_Var11 = (_uniforms->super_Scene).models._M_t._M_impl.super__Rb_tree_header._M_header.
                 _M_left; p_Var11 != local_250;
      p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
    vera::Model::setShader(*(Model **)(p_Var11 + 2),_fragmentShader,_vertexShader);
    if (this->m_shadows == true) {
      pMVar12 = *(Model **)(p_Var11 + 2);
      std::__cxx11::string::string((string *)&local_70,"shadow",(allocator *)&local_298);
      vera::getDefaultSrc_abi_cxx11_(&bufferName,(vera *)0xb,_type_00);
      vera::Model::setBufferShader(pMVar12,&local_70,&bufferName,_vertexShader);
      std::__cxx11::string::~string((string *)&bufferName);
      std::__cxx11::string::~string((string *)&local_70);
    }
    if (bVar4) {
      pMVar12 = *(Model **)(p_Var11 + 2);
      std::__cxx11::string::string((string *)&local_90,"position",(allocator *)&local_298);
      vera::getDefaultSrc_abi_cxx11_(&bufferName,(vera *)0x12,_type_01);
      vera::Model::setBufferShader(pMVar12,&local_90,&bufferName,_vertexShader);
      std::__cxx11::string::~string((string *)&bufferName);
      std::__cxx11::string::~string((string *)&local_90);
    }
    if (bVar5) {
      pMVar12 = *(Model **)(p_Var11 + 2);
      std::__cxx11::string::string((string *)&local_b0,"normal",(allocator *)&local_298);
      vera::getDefaultSrc_abi_cxx11_(&bufferName,(vera *)0x13,_type_02);
      vera::Model::setBufferShader(pMVar12,&local_b0,&bufferName,_vertexShader);
      std::__cxx11::string::~string((string *)&bufferName);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    for (local_270._M_dataplus._M_p = (pointer)0x0;
        local_270._M_dataplus._M_p < (pointer)this->m_buffers_total;
        local_270._M_dataplus._M_p = local_270._M_dataplus._M_p + 1) {
      vera::toString<unsigned_long>(&local_298,(unsigned_long *)&local_270);
      std::operator+(&bufferName,"u_sceneBuffer",&local_298);
      std::__cxx11::string::~string((string *)&local_298);
      pMVar12 = *(Model **)(p_Var11 + 2);
      std::__cxx11::string::string((string *)&local_d0,(string *)&bufferName);
      vera::Model::setBufferShader(pMVar12,&local_d0,_fragmentShader,_vertexShader);
      std::__cxx11::string::~string((string *)&local_d0);
      pSVar10 = vera::Model::getBufferShader(*(Model **)(p_Var11 + 2),&bufferName);
      std::__cxx11::string::string((string *)&local_298,"FLOOR",(allocator *)&local_248);
      (*(pSVar10->super_HaveDefines)._vptr_HaveDefines[0xb])(pSVar10,&local_298);
      std::__cxx11::string::~string((string *)&local_298);
      pSVar10 = vera::Model::getBufferShader(*(Model **)(p_Var11 + 2),&bufferName);
      vera::toString<unsigned_long>(&local_248,(unsigned_long *)&local_270);
      std::operator+(&local_298,"SCENE_BUFFER_",&local_248);
      std::__cxx11::string::string((string *)&local_228,"",(allocator *)&local_150);
      (*(pSVar10->super_HaveDefines)._vptr_HaveDefines[10])(pSVar10,&local_298,&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&bufferName);
    }
  }
  bVar6 = checkFloor(_fragmentShader);
  if (!bVar6) {
    bVar6 = checkFloor(_vertexShader);
    if (!bVar6) goto LAB_001f1f06;
  }
  pMVar12 = &this->m_floor;
  if ((this->m_floor).m_model_vbo == (Vbo *)0x0) {
    std::__cxx11::string::string((string *)&bufferName,"FLOOR",(allocator *)&local_298);
    vera::Model::setName(pMVar12,&bufferName);
    std::__cxx11::string::~string((string *)&bufferName);
    vera::planeMesh((Mesh *)&bufferName,1.0,1.0,2,2,TRIANGLES);
    vera::Model::setGeom(pMVar12,(Mesh *)&bufferName);
    vera::Mesh::~Mesh((Mesh *)&bufferName);
  }
  vera::Model::setShader(pMVar12,_fragmentShader,_vertexShader);
  if (this->m_floor_subd == -1) {
    this->m_floor_subd_target = 0;
  }
  if (this->m_shadows == true) {
    std::__cxx11::string::string((string *)&local_f0,"shadow",(allocator *)&local_298);
    vera::getDefaultSrc_abi_cxx11_(&bufferName,(vera *)0xb,_type_03);
    vera::Model::setBufferShader(pMVar12,&local_f0,&bufferName,_vertexShader);
    std::__cxx11::string::~string((string *)&bufferName);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  if (bVar4) {
    std::__cxx11::string::string((string *)&local_110,"position",(allocator *)&local_298);
    vera::getDefaultSrc_abi_cxx11_(&bufferName,(vera *)0x12,_type_04);
    vera::Model::setBufferShader(pMVar12,&local_110,&bufferName,_vertexShader);
    std::__cxx11::string::~string((string *)&bufferName);
    std::__cxx11::string::~string((string *)&local_110);
  }
  if (bVar5) {
    std::__cxx11::string::string((string *)&local_130,"normal",(allocator *)&local_298);
    vera::getDefaultSrc_abi_cxx11_(&bufferName,(vera *)0x13,_type_05);
    vera::Model::setBufferShader(pMVar12,&local_130,&bufferName,_vertexShader);
    std::__cxx11::string::~string((string *)&bufferName);
    std::__cxx11::string::~string((string *)&local_130);
  }
  for (local_270._M_dataplus._M_p = (pointer)0x0;
      local_270._M_dataplus._M_p < (pointer)this->m_buffers_total;
      local_270._M_dataplus._M_p = local_270._M_dataplus._M_p + 1) {
    vera::toString<unsigned_long>(&local_298,(unsigned_long *)&local_270);
    std::operator+(&bufferName,"u_sceneBuffer",&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::string((string *)&local_50,(string *)&bufferName);
    vera::Model::setBufferShader(pMVar12,&local_50,_fragmentShader,_vertexShader);
    std::__cxx11::string::~string((string *)&local_50);
    pSVar10 = vera::Model::getBufferShader(pMVar12,&bufferName);
    std::__cxx11::string::string((string *)&local_298,"FLOOR",(allocator *)&local_228);
    std::__cxx11::string::string((string *)&local_248,"",(allocator *)&local_150);
    (*(pSVar10->super_HaveDefines)._vptr_HaveDefines[10])(pSVar10,&local_298,&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_298);
    pSVar10 = vera::Model::getBufferShader(pMVar12,&bufferName);
    vera::toString<unsigned_long>(&local_248,(unsigned_long *)&local_270);
    std::operator+(&local_298,"SCENE_BUFFER_",&local_248);
    std::__cxx11::string::string((string *)&local_228,"",(allocator *)&local_150);
    (*(pSVar10->super_HaveDefines)._vptr_HaveDefines[10])(pSVar10,&local_298,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&bufferName);
  }
LAB_001f1f06:
  uVar9 = countDevLookSpheres(_fragmentShader);
  lVar14 = (long)(int)uVar9;
  pvVar1 = &this->m_devlook_spheres;
  ppMVar2 = (this->m_devlook_spheres).
            super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppMVar3 = (this->m_devlook_spheres).
            super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((long)ppMVar3 - (long)ppMVar2 >> 3 == lVar14) {
    if (0 < (int)uVar9) {
      for (uVar15 = 0; uVar9 != uVar15; uVar15 = uVar15 + 1) {
        pMVar12 = (pvVar1->super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>).
                  _M_impl.super__Vector_impl_data._M_start[uVar15];
        vera::getDefaultSrc_abi_cxx11_(&bufferName,(vera *)0x19,(DefaultShaders)lVar14);
        vera::Model::setShader(pMVar12,_fragmentShader,&bufferName);
        std::__cxx11::string::~string((string *)&bufferName);
        lVar14 = extraout_RDX;
      }
    }
  }
  else {
    if (ppMVar3 != ppMVar2) {
      (this->m_devlook_spheres).super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppMVar2;
    }
    iVar8 = 0;
    while( true ) {
      local_270._M_dataplus._M_p._0_4_ = iVar8;
      if ((int)uVar9 <= iVar8) break;
      pMVar12 = (Model *)operator_new(0x2d8);
      vera::toString<int>(&local_248,(int *)&local_270);
      std::operator+(&local_298,"DEVLOOK_SPHERE_",&local_248);
      vera::sphereMesh((Mesh *)&bufferName,0x18,1.0,TRIANGLES);
      vera::Model::Model(pMVar12,&local_298,(Mesh *)&bufferName);
      local_228._M_dataplus._M_p = (pointer)pMVar12;
      std::vector<vera::Model*,std::allocator<vera::Model*>>::emplace_back<vera::Model*>
                ((vector<vera::Model*,std::allocator<vera::Model*>> *)pvVar1,(Model **)&local_228);
      vera::Mesh::~Mesh((Mesh *)&bufferName);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_248);
      pMVar12 = (pvVar1->super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>)._M_impl.
                super__Vector_impl_data._M_start[(int)local_270._M_dataplus._M_p];
      vera::getDefaultSrc_abi_cxx11_(&bufferName,(vera *)0x19,_type_06);
      vera::Model::setShader(pMVar12,_fragmentShader,&bufferName);
      std::__cxx11::string::~string((string *)&bufferName);
      pSVar10 = &(pvVar1->super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>)._M_impl
                 .super__Vector_impl_data._M_start[(int)local_270._M_dataplus._M_p]->mainShader;
      vera::toString<int>(&local_298,(int *)&local_270);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &bufferName,"DEVLOOK_SPHERE_",&local_298);
      std::__cxx11::string::string((string *)&local_248,"",(allocator *)&local_228);
      (**(code **)((long)(pSVar10->super_HaveDefines)._vptr_HaveDefines + 0x50))
                (pSVar10,&bufferName,&local_248);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&bufferName);
      std::__cxx11::string::~string((string *)&local_298);
      pMVar12 = (pvVar1->super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>)._M_impl.
                super__Vector_impl_data._M_start[(int)local_270._M_dataplus._M_p];
      std::__cxx11::string::string((string *)&bufferName,"DEVLOOK_Y_OFFSET",(allocator *)&local_298)
      ;
      (**(code **)((long)(pMVar12->mainShader).super_HaveDefines._vptr_HaveDefines + 0x20))
                ((double)(int)local_270._M_dataplus._M_p * -0.35 + 0.8,&pMVar12->mainShader,
                 &bufferName);
      std::__cxx11::string::~string((string *)&bufferName);
      iVar8 = (int)local_270._M_dataplus._M_p + 1;
    }
  }
  uVar9 = countDevLookBillboards(_fragmentShader);
  lVar14 = (long)(int)uVar9;
  pvVar1 = &this->m_devlook_billboards;
  ppMVar2 = (this->m_devlook_billboards).
            super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppMVar3 = (this->m_devlook_billboards).
            super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((long)ppMVar3 - (long)ppMVar2 >> 3 == lVar14) {
    if (0 < (int)uVar9) {
      for (uVar15 = 0; uVar9 != uVar15; uVar15 = uVar15 + 1) {
        pMVar12 = (pvVar1->super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>).
                  _M_impl.super__Vector_impl_data._M_start[uVar15];
        vera::getDefaultSrc_abi_cxx11_(&bufferName,(vera *)0x18,(DefaultShaders)lVar14);
        vera::Model::setShader(pMVar12,_fragmentShader,&bufferName);
        std::__cxx11::string::~string((string *)&bufferName);
        lVar14 = extraout_RDX_00;
      }
    }
  }
  else {
    if (ppMVar3 != ppMVar2) {
      (this->m_devlook_billboards).super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppMVar2;
    }
    local_250 = (_Rb_tree_node_base *)CONCAT44(local_250._4_4_,uVar9);
    iVar8 = 0;
    while (local_270._M_dataplus._M_p._0_4_ = iVar8, iVar8 < (int)uVar9) {
      pMVar12 = (Model *)operator_new(0x2d8);
      vera::toString<int>(&local_248,(int *)&local_270);
      std::operator+(&local_298,"DEVLOOK_BILLBOARD_",&local_248);
      vera::planeMesh((Mesh *)&bufferName,1.0,1.0,2,2,TRIANGLES);
      vera::Model::Model(pMVar12,&local_298,(Mesh *)&bufferName);
      local_228._M_dataplus._M_p = (pointer)pMVar12;
      std::vector<vera::Model*,std::allocator<vera::Model*>>::emplace_back<vera::Model*>
                ((vector<vera::Model*,std::allocator<vera::Model*>> *)pvVar1,(Model **)&local_228);
      vera::Mesh::~Mesh((Mesh *)&bufferName);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_248);
      pMVar12 = (pvVar1->super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>)._M_impl.
                super__Vector_impl_data._M_start[(int)local_270._M_dataplus._M_p];
      vera::getDefaultSrc_abi_cxx11_(&bufferName,(vera *)0x18,_type_07);
      vera::Model::setShader(pMVar12,_fragmentShader,&bufferName);
      std::__cxx11::string::~string((string *)&bufferName);
      pSVar10 = &(pvVar1->super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>)._M_impl
                 .super__Vector_impl_data._M_start[(int)local_270._M_dataplus._M_p]->mainShader;
      vera::toString<int>(&local_298,(int *)&local_270);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &bufferName,"DEVLOOK_BILLBOARD_",&local_298);
      std::__cxx11::string::string((string *)&local_248,"",(allocator *)&local_228);
      (**(code **)((long)(pSVar10->super_HaveDefines)._vptr_HaveDefines + 0x50))
                (pSVar10,&bufferName,&local_248);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&bufferName);
      std::__cxx11::string::~string((string *)&local_298);
      pMVar12 = (pvVar1->super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>)._M_impl.
                super__Vector_impl_data._M_start[(int)local_270._M_dataplus._M_p];
      std::__cxx11::string::string((string *)&bufferName,"DEVLOOK_Y_OFFSET",(allocator *)&local_298)
      ;
      lVar14 = (long)(this->m_devlook_spheres).
                     super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->m_devlook_spheres).
                     super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
      lVar13 = lVar14 >> 3;
      auVar16._8_4_ = (int)(lVar14 >> 0x23);
      auVar16._0_8_ = lVar13;
      auVar16._12_4_ = 0x45300000;
      (**(code **)((long)(pMVar12->mainShader).super_HaveDefines._vptr_HaveDefines + 0x20))
                ((double)(int)local_270._M_dataplus._M_p * -0.325 +
                 ((auVar16._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0)) * -0.35 + 0.8,
                 &pMVar12->mainShader,&bufferName);
      std::__cxx11::string::~string((string *)&bufferName);
      uVar9 = (uint)local_250;
      iVar8 = (int)local_270._M_dataplus._M_p + 1;
    }
  }
  return;
}

Assistant:

void SceneRender::setShaders(Uniforms& _uniforms, const std::string& _fragmentShader, const std::string& _vertexShader) {
    // Background
    m_background = checkBackground(_fragmentShader);
    if (m_background) {
        // Specific defines for this buffer
        m_background_shader.addDefine("BACKGROUND");
        m_background_shader.setSource(_fragmentShader, vera::getDefaultSrc(vera::VERT_BILLBOARD));
        m_background_shader.addDefine("GLSLVIEWER", vera::toString(GLSLVIEWER_VERSION_MAJOR) + vera::toString(GLSLVIEWER_VERSION_MINOR) + vera::toString(GLSLVIEWER_VERSION_PATCH) );
    }

    bool position_buffer = findId(_fragmentShader, "u_scenePosition;");
    bool normal_buffer = findId(_fragmentShader, "u_sceneNormal;");
    m_shadows = findId(_fragmentShader, "u_lightShadowMap;");
    m_buffers_total = std::max( countSceneBuffers(_vertexShader), 
                                countSceneBuffers(_fragmentShader) );

    for (vera::ModelsMap::iterator it = _uniforms.models.begin(); it != _uniforms.models.end(); ++it) {
        it->second->setShader( _fragmentShader, _vertexShader);

        if (m_shadows)
            it->second->setBufferShader("shadow", vera::getDefaultSrc(vera::FRAG_ERROR), _vertexShader);

        if (position_buffer)
            it->second->setBufferShader("position", vera::getDefaultSrc(vera::FRAG_POSITION), _vertexShader);
        
        if (normal_buffer)
            it->second->setBufferShader("normal", vera::getDefaultSrc(vera::FRAG_NORMAL), _vertexShader);

        for (size_t i = 0; i < m_buffers_total; i++) {
            std::string bufferName = "u_sceneBuffer" + vera::toString(i);
            it->second->setBufferShader(bufferName, _fragmentShader, _vertexShader);
            it->second->getBufferShader(bufferName)->delDefine("FLOOR");
            it->second->getBufferShader(bufferName)->addDefine("SCENE_BUFFER_" + vera::toString(i));
        }
    }

    // Floor
    bool thereIsFloorDefine = checkFloor(_fragmentShader) || checkFloor(_vertexShader);
    if (thereIsFloorDefine) {
        if (m_floor.getVbo() == nullptr) {
            m_floor.setName("FLOOR");
            m_floor.setGeom( vera::planeMesh(1.0f, 1.0f, 2, 2) );
        }

        m_floor.setShader(_fragmentShader, _vertexShader);

        if (m_floor_subd == -1)
            m_floor_subd_target = 0;

        if (m_shadows) 
            m_floor.setBufferShader("shadow", vera::getDefaultSrc(vera::FRAG_ERROR), _vertexShader);

        if (position_buffer)
            m_floor.setBufferShader("position", vera::getDefaultSrc(vera::FRAG_POSITION), _vertexShader);
        
        if (normal_buffer)
            m_floor.setBufferShader("normal", vera::getDefaultSrc(vera::FRAG_NORMAL), _vertexShader);

        for (size_t i = 0; i < m_buffers_total; i++) {
            std::string bufferName = "u_sceneBuffer" + vera::toString(i);
            m_floor.setBufferShader(bufferName, _fragmentShader, _vertexShader);
            m_floor.getBufferShader(bufferName)->addDefine("FLOOR");
            m_floor.getBufferShader(bufferName)->addDefine("SCENE_BUFFER_" + vera::toString(i));
        }
    }

    // DevLook
    int devLookSpheres = countDevLookSpheres(_fragmentShader);
    if (devLookSpheres != m_devlook_spheres.size()) {
        m_devlook_spheres.clear();

        for (int i = 0; i < devLookSpheres; i++) {
            m_devlook_spheres.push_back( new vera::Model("DEVLOOK_SPHERE_" + vera::toString(i), vera::sphereMesh(24)) );

            m_devlook_spheres[i]->setShader(_fragmentShader, vera::getDefaultSrc(vera::VERT_DEVLOOK_SPHERE));
            m_devlook_spheres[i]->getShader()->addDefine("DEVLOOK_SPHERE_" + vera::toString(i));
            m_devlook_spheres[i]->getShader()->addDefine("DEVLOOK_Y_OFFSET", 0.8 - i * 0.35);
        }
    }
    else if (devLookSpheres > 0)
        for (int i = 0; i < devLookSpheres; i++)
            m_devlook_spheres[i]->setShader(_fragmentShader, vera::getDefaultSrc(vera::VERT_DEVLOOK_SPHERE));

    int devLookBillboards = countDevLookBillboards(_fragmentShader);
    if (devLookBillboards != m_devlook_billboards.size()) {
        m_devlook_billboards.clear();

        for (int i = 0; i < devLookBillboards; i++) {
            m_devlook_billboards.push_back( new vera::Model("DEVLOOK_BILLBOARD_" + vera::toString(i), vera::planeMesh(1.0f, 1.0f, 2, 2)) );

            m_devlook_billboards[i]->setShader(_fragmentShader, vera::getDefaultSrc(vera::VERT_DEVLOOK_BILLBOARD));
            m_devlook_billboards[i]->getShader()->addDefine("DEVLOOK_BILLBOARD_" + vera::toString(i));
            m_devlook_billboards[i]->getShader()->addDefine("DEVLOOK_Y_OFFSET", 0.8 - m_devlook_spheres.size() * 0.35 - i * 0.325);
        }
    }
    else if (devLookBillboards > 0)
        for (int i = 0; i < devLookBillboards; i++)
            m_devlook_billboards[i]->setShader(_fragmentShader, vera::getDefaultSrc(vera::VERT_DEVLOOK_BILLBOARD));

}